

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Prune::_Test_Prune(_Test_Prune *this)

{
  _Test_Prune *this_local;
  
  CacheTest::CacheTest(&this->super_CacheTest);
  return;
}

Assistant:

TEST(CacheTest, Prune) {
  Insert(1, 100);
  Insert(2, 200);

  Cache::Handle* handle = cache_->Lookup(EncodeKey(1));
  ASSERT_TRUE(handle);
  cache_->Prune();
  cache_->Release(handle);

  ASSERT_EQ(100, Lookup(1));
  ASSERT_EQ(-1, Lookup(2));
}